

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

long __thiscall
duckdb::Interpolator<false>::Extract<long,long>(Interpolator<false> *this,long *dest,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = this->CRN;
  iVar2 = this->FRN;
  lVar3 = Cast::Operation<long,long>(*dest);
  if (iVar1 != iVar2) {
    lVar4 = Cast::Operation<long,long>(dest[1]);
    lVar3 = (long)((double)(lVar4 - lVar3) *
                   (this->RN -
                   (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25)
                   + ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                  (double)lVar3);
  }
  return lVar3;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}